

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O3

realtype N_VMaxNorm_SensWrapper(N_Vector x)

{
  long *plVar1;
  long lVar2;
  realtype rVar3;
  double dVar4;
  
  plVar1 = (long *)x->content;
  if ((int)plVar1[1] < 1) {
    rVar3 = 0.0;
  }
  else {
    lVar2 = 0;
    dVar4 = 0.0;
    do {
      rVar3 = N_VMaxNorm(*(N_Vector *)(*plVar1 + lVar2 * 8));
      if (rVar3 <= dVar4) {
        rVar3 = dVar4;
      }
      lVar2 = lVar2 + 1;
      plVar1 = (long *)x->content;
      dVar4 = rVar3;
    } while (lVar2 < (int)plVar1[1]);
  }
  return rVar3;
}

Assistant:

realtype N_VMaxNorm_SensWrapper(N_Vector x)
{
  int i;
  realtype max, tmp;

  max = ZERO;

  for (i=0; i < NV_NVECS_SW(x); i++) {
    tmp = N_VMaxNorm(NV_VEC_SW(x,i));
    if (tmp > max) max = tmp;
  }

  return(max);
}